

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O3

void __thiscall bwtil::PartialSums::increment(PartialSums *this,symbol s)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  bVar1 = this->d;
  uVar7 = (uint)(s / bVar1) + ((uint)this->nr_of_nodes - (uint)this->nr_of_leafs);
  uVar8 = (ulong)uVar7;
  if (s % bVar1 == 0) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    uVar5 = ~(-1L << ((ulong)((uint)this->log2n * ((uint)bVar1 - (uint)(s % bVar1))) & 0x3f));
  }
  puVar3 = (this->nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(this->nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
  if (uVar8 < uVar6) {
    puVar3[uVar8] = puVar3[uVar8] + (uVar5 & this->ones);
    if (uVar8 != 0) {
      bVar2 = this->log2n;
      uVar8 = (ulong)(ushort)uVar7;
      do {
        lVar4 = (long)((int)uVar8 + -1) % (long)(int)(bVar1 + 1);
        uVar7 = (uint)lVar4;
        uVar8 = (long)(int)(~uVar7 + (int)uVar8) / (long)(int)(bVar1 + 1) & 0xffff;
        if (uVar6 <= uVar8) goto LAB_001125dc;
        puVar3[uVar8] =
             puVar3[uVar8] +
             ((-(ulong)((char)lVar4 == '\0') |
              ~(-1L << ((ulong)((bVar1 - uVar7) * (uint)bVar2) & 0x3f))) & this->ones);
      } while (uVar8 != 0);
    }
    return;
  }
LAB_001125dc:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8,uVar6
            );
}

Assistant:

void increment(symbol s){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): increment() called on empty counter\n";
			exit(0);
		}
	#endif

	#ifdef DEBUG
		if(s>=sigma){
			cout << "ERROR (PartialSums): symbol " << s << " not in alphabet.\n";
			exit(0);
		}
	#endif

		uint current_node = (nr_of_nodes - nr_of_leafs) + (s/d);//offset leafs + leaf number
		uint offset_in_node = s%d;//number of the counter inside the node

		incrementFrom(&nodes, current_node, offset_in_node);//increment counters in the leaf

		while(current_node>0){//repeat while current node is not the root

			offset_in_node = childNumber(current_node);
			current_node = parent(current_node);

			incrementFrom(&nodes, current_node, offset_in_node);

		}

	}